

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.h
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::GetSubBlockOffset(ChElementBeamTaperedTimoshenko *this)

{
  return;
}

Assistant:

virtual unsigned int GetSubBlockOffset(int nblock) override { return nodes[nblock]->NodeGetOffset_w(); }